

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t internal_exr_write_header(_internal_exr_context *ctxt)

{
  _internal_exr_part *p_Var1;
  exr_attribute_t *a;
  char *__s1;
  exr_result_t eVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint64_t *puVar7;
  uint8_t next_byte;
  uint32_t magic_and_version [2];
  undefined1 local_4d;
  uint local_4c;
  uint64_t *local_48;
  long local_40;
  undefined4 local_38;
  uint local_34;
  
  uVar4 = (uint)(ctxt->is_singlepart_tiled != '\0') * 0x200 +
          ((uint)(ctxt->has_nonimage_data != '\0') << 0xb |
          (uint)(0x1f < ctxt->max_name_length) << 10 | (uint)(ctxt->is_multipart != '\0') << 0xc) +
          2;
  local_38 = 0x1312f76;
  puVar7 = &ctxt->output_file_offset;
  local_34 = uVar4;
  eVar2 = (*ctxt->do_write)(ctxt,&local_38,8,puVar7);
  if (eVar2 == 0) {
    lVar6 = 0;
    local_4c = uVar4;
    local_48 = puVar7;
    while (lVar6 < ctxt->num_parts) {
      p_Var1 = ctxt->parts[lVar6];
      iVar5 = (p_Var1->attributes).num_attributes;
      local_40 = lVar6;
      if (ctxt->legacy_header == '\0') {
        if (0 < iVar5) {
          lVar6 = 0;
          do {
            eVar2 = save_attr(ctxt,(p_Var1->attributes).entries[lVar6]);
            if (eVar2 != 0) {
              return eVar2;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (p_Var1->attributes).num_attributes);
        }
      }
      else if (0 < iVar5) {
        lVar6 = 0;
        do {
          a = (p_Var1->attributes).sorted_entries[lVar6];
          if (((local_4c & 0x1800) == 0) && (ctxt->num_parts == 1)) {
            __s1 = a->name;
            iVar3 = strcmp(__s1,"type");
            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"name"), iVar3 != 0)) goto LAB_0011f847;
          }
          else {
LAB_0011f847:
            eVar2 = save_attr(ctxt,a);
            if (eVar2 != 0) {
              return eVar2;
            }
            iVar5 = (p_Var1->attributes).num_attributes;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar5);
      }
      puVar7 = local_48;
      local_4d = 0;
      eVar2 = (*ctxt->do_write)(ctxt,&local_4d,1,local_48);
      lVar6 = local_40 + 1;
      if (eVar2 != 0) {
        return eVar2;
      }
    }
    if (ctxt->is_multipart == '\0') {
      eVar2 = 0;
    }
    else {
      local_4d = 0;
      eVar2 = (*ctxt->do_write)(ctxt,&local_4d,1,puVar7);
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_write_header (struct _internal_exr_context* ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    flags = 2; // EXR_VERSION
    if (ctxt->is_multipart) flags |= EXR_MULTI_PART_FLAG;
    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
        flags |= EXR_LONG_NAMES_FLAG;
    if (ctxt->has_nonimage_data) flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) flags |= EXR_TILED_FLAG;

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t *curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG |EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}